

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

Am_Slot_Demon * __thiscall Am_Demon_Set::Get_Slot_Demon(Am_Demon_Set *this,unsigned_short which_bit)

{
  int local_20;
  int i;
  unsigned_short which_bit_local;
  Am_Demon_Set *this_local;
  
  for (local_20 = 0; local_20 < (int)(uint)this->data->invalid_length; local_20 = local_20 + 1) {
    if (this->data->invalid_demons[local_20].which_bit == which_bit) {
      return this->data->invalid_demons[local_20].demon;
    }
  }
  local_20 = 0;
  while( true ) {
    if ((int)(uint)this->data->change_length <= local_20) {
      return (Am_Slot_Demon *)0x0;
    }
    if (this->data->change_demons[local_20].which_bit == which_bit) break;
    local_20 = local_20 + 1;
  }
  return this->data->change_demons[local_20].demon;
}

Assistant:

Am_Slot_Demon *
Am_Demon_Set::Get_Slot_Demon(unsigned short which_bit) const
{
  int i;
  for (i = 0; i < data->invalid_length; ++i)
    if (data->invalid_demons[i].which_bit == which_bit)
      return data->invalid_demons[i].demon;
  for (i = 0; i < data->change_length; ++i)
    if (data->change_demons[i].which_bit == which_bit)
      return data->change_demons[i].demon;
  return nullptr;
}